

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall JetHead::Socket::checkSocketHealth(Socket *this,uint32_t thresholdSeconds)

{
  uint32_t i;
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  socklen_t info_len;
  tcp_info info;
  
  uVar3 = 0;
  uVar4 = 1;
  for (uVar1 = thresholdSeconds; 1 < uVar1; uVar1 = uVar1 >> 1) {
    uVar3 = uVar3 + 2;
    uVar4 = uVar4 + 1;
  }
  info_len = 0x68;
  iVar2 = getsockopt(this->mFd,6,0xb,&info,&info_len);
  if (iVar2 == 0) {
    if ((uVar4 < info.tcpi_retransmits) && (thresholdSeconds * 1000 < info.tcpi_last_ack_recv)) {
      jh_log_print(0,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x2f2,"failed for retransmits %d");
      iVar2 = 0x2f4;
    }
    else {
      if (info.tcpi_probes == '\0') {
        return 0;
      }
      if ((uint)info.tcpi_backoff + (uint)info.tcpi_probes <= uVar3) {
        return 0;
      }
      if (info.tcpi_last_ack_recv <= thresholdSeconds * 1000) {
        return 0;
      }
      jh_log_print(0,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x300,"failed for probes %d");
      iVar2 = 0x302;
    }
    jh_log_print(2,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,iVar2,"last_ack_recv %d, backoff %d",(ulong)info.tcpi_last_ack_recv,
                 (uint)info.tcpi_backoff);
    uVar4 = info.tcpi_last_ack_recv / 1000;
  }
  else {
    jh_log_print(3,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x2e7,"failed to getsockopt TCP_INFO");
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

int Socket::checkSocketHealth(uint32_t thresholdSeconds)
{
#ifdef PLATFORM_DARWIN
	return 0;
#else
	// Compute the log of the thresholdSeconds for use below
	uint8_t thresholdMagnitude = 0;
	for (uint32_t i = thresholdSeconds; i > 1; i /= 2, ++thresholdMagnitude);

	struct tcp_info info;
	socklen_t info_len = sizeof(info);

	if ( getsockopt(mFd, IPPROTO_TCP, TCP_INFO, &info, &info_len) )
	{
		LOG_WARN_PERROR("failed to getsockopt TCP_INFO");
		return -1;
	}

	// For the "sending" state: see if the number of outstanding
	// retransmits currently exceeds one more than the magnitude of
	// the threshold and if the last ack we have received from the
	// client is older than the threshold
	if (info.tcpi_retransmits > thresholdMagnitude + 1 &&
		info.tcpi_last_ack_recv > thresholdSeconds * 1000)
	{
		LOG_ERR("failed for retransmits %d", info.tcpi_retransmits);
		LOG_WARN("last_ack_recv %d, backoff %d",
				 info.tcpi_last_ack_recv, info.tcpi_backoff);
		return info.tcpi_last_ack_recv / 1000;
	}
	// For the "zero-window probe" state: See if we have missed any
	// probes, and if the total of missed probes and the backoff
	// exceeds twice the magnitude of the of the threshold, and if the
	// last ack we have received from the client is older than the
	// threshold
	if (info.tcpi_probes > 0 &&
		info.tcpi_probes + info.tcpi_backoff > thresholdMagnitude * 2 &&
		info.tcpi_last_ack_recv > thresholdSeconds * 1000)
	{
		LOG_ERR("failed for probes %d", info.tcpi_probes);
		LOG_WARN("last_ack_recv %d, backoff %d",
				 info.tcpi_last_ack_recv, info.tcpi_backoff);
		return info.tcpi_last_ack_recv / 1000;
	}
	
	// Socket health looks good *or* anything bad is still under threshold
	return 0;
#endif
}